

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_AccessStepMem
              (void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKodeERKStepMem *step_mem)

{
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
  }
  else {
    *ark_mem = (ARKodeMem)arkode_mem;
    if (*(ARKodeERKStepMem *)((long)arkode_mem + 0xe8) != (ARKodeERKStepMem)0x0) {
      *step_mem = *(ARKodeERKStepMem *)((long)arkode_mem + 0xe8);
      return 0;
    }
    msgfmt = "Time step module memory is NULL.";
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,"ARKode::ERKStep",fname,msgfmt);
  return -0x15;
}

Assistant:

int erkStep_AccessStepMem(void* arkode_mem, const char *fname,
                          ARKodeMem *ark_mem, ARKodeERKStepMem *step_mem)
{

  /* access ARKodeMem structure */
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ERKStep",
                    fname, MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  *ark_mem = (ARKodeMem) arkode_mem;
  if ((*ark_mem)->step_mem==NULL) {
    arkProcessError(*ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    fname, MSG_ERKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  *step_mem = (ARKodeERKStepMem) (*ark_mem)->step_mem;
  return(ARK_SUCCESS);
}